

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O2

void Abc_NtkToBarBufsCollect_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  long lVar2;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 != 0) {
    return;
  }
  Abc_NodeSetTravIdCurrent(pObj);
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 7) {
    for (lVar2 = 0; lVar2 < (pObj->vFanins).nSize; lVar2 = lVar2 + 1) {
      Abc_NtkToBarBufsCollect_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar2]],vNodes);
    }
    Vec_PtrPush(vNodes,pObj);
    return;
  }
  __assert_fail("Abc_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                ,0x15b,"void Abc_NtkToBarBufsCollect_rec(Abc_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Abc_NtkToBarBufsCollect_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin; 
    int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    assert( Abc_ObjIsNode(pObj) );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_NtkToBarBufsCollect_rec( pFanin, vNodes );
    Vec_PtrPush( vNodes, pObj );
}